

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::PageTable::DestroyL3Table(PageTable *this)

{
  undefined1 local_40 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  GMM_CLIENT ClientType;
  uint8_t hr;
  GMM_STATUS Status;
  PageTable *this_local;
  
  ClientType = GMM_KMD_VISTA;
  memset(local_40,0,0x20);
  if (this->pClientContext == (GmmClientContext *)0x0) {
    Dealloc.hCsr._4_4_ = GMM_UNDEFINED_CLIENT;
  }
  else {
    Dealloc.hCsr._4_4_ = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  EnterCriticalSection(&this->TTLock);
  if ((this->TTL3).L3Handle != (HANDLE)0x0) {
    local_40 = (undefined1  [8])(this->TTL3).L3Handle;
    Dealloc.Handle = (HANDLE)(this->TTL3).GfxAddress;
    Dealloc.GfxVA = (GMM_GFX_ADDRESS)(this->TTL3).pGmmResInfo;
    Dealloc.Priv = this->PageTableMgr->hCsr;
    ClientType = __GmmDeviceDealloc(Dealloc.hCsr._4_4_,&this->PageTableMgr->DeviceCbInt,
                                    (GMM_DEVICE_DEALLOC *)local_40,this->pClientContext);
    (this->TTL3).L3Handle = (HANDLE)0x0;
    (this->TTL3).GfxAddress = 0;
    (this->TTL3).CPUAddress = 0;
  }
  LeaveCriticalSection(&this->TTLock);
  return ClientType;
}

Assistant:

GMM_STATUS GmmLib::PageTable::DestroyL3Table()
{
    GMM_STATUS         Status = GMM_SUCCESS;
    uint8_t            hr     = GMM_SUCCESS;
    GMM_CLIENT         ClientType;
    GMM_DEVICE_DEALLOC Dealloc = {0};

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    EnterCriticalSection(&TTLock);

    if(TTL3.L3Handle)
    {
        Dealloc.Handle = TTL3.L3Handle;
        Dealloc.GfxVA  = TTL3.GfxAddress;
        Dealloc.Priv   = TTL3.pGmmResInfo;
        Dealloc.hCsr   = PageTableMgr->hCsr;

        Status = __GmmDeviceDealloc(ClientType, &PageTableMgr->DeviceCbInt, &Dealloc, pClientContext);

        TTL3.L3Handle   = NULL;
        TTL3.GfxAddress = 0;
        TTL3.CPUAddress = 0;
    }

    LeaveCriticalSection(&TTLock);
    return Status;
}